

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c++
# Opt level: O0

double kj::_::parseDouble(StringPtr *s)

{
  bool bVar1;
  int *piVar2;
  char *text;
  Fault local_b8;
  Fault f_1;
  char **local_a8;
  undefined1 local_a0 [8];
  DebugComparison<char_*&,_const_char_*> _kjCondition_1;
  double value;
  char *endPtr;
  Fault local_58;
  Fault f;
  StringPtr *local_48;
  undefined1 local_40 [8];
  DebugComparison<const_kj::StringPtr_&,_std::nullptr_t> _kjCondition;
  StringPtr *s_local;
  
  _kjCondition._32_8_ = s;
  local_48 = (StringPtr *)DebugExpressionStart::operator<<((DebugExpressionStart *)&MAGIC_ASSERT,s);
  f.exception = (Exception *)0x0;
  DebugExpression<kj::StringPtr_const&>::operator!=
            ((DebugComparison<const_kj::StringPtr_&,_std::nullptr_t> *)local_40,
             (DebugExpression<kj::StringPtr_const&> *)&local_48,&f.exception);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_40);
  if (bVar1) {
    piVar2 = __errno_location();
    *piVar2 = 0;
    text = StringPtr::begin((StringPtr *)_kjCondition._32_8_);
    _kjCondition_1._32_8_ = anon_unknown_0::NoLocaleStrtod(text,(char **)&value);
    local_a8 = (char **)DebugExpressionStart::operator<<
                                  ((DebugExpressionStart *)&MAGIC_ASSERT,(char **)&value);
    f_1.exception = (Exception *)StringPtr::end((StringPtr *)_kjCondition._32_8_);
    DebugExpression<char*&>::operator==
              ((DebugComparison<char_*&,_const_char_*> *)local_a0,
               (DebugExpression<char*&> *)&local_a8,(char **)&f_1);
    bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_a0);
    if (bVar1) {
      s_local = (StringPtr *)_kjCondition_1._32_8_;
    }
    else {
      Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<char*&,char_const*>&,char_const(&)[46],kj::StringPtr_const&>
                (&local_b8,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string.c++"
                 ,0x256,FAILED,"endPtr == s.end()",
                 "_kjCondition,\"String does not contain valid floating number\", s",
                 (DebugComparison<char_*&,_const_char_*> *)local_a0,
                 (char (*) [46])"String does not contain valid floating number",
                 (StringPtr *)_kjCondition._32_8_);
      s_local = (StringPtr *)0x0;
      Debug::Fault::~Fault(&local_b8);
    }
  }
  else {
    Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<kj::StringPtr_const&,decltype(nullptr)>&,char_const(&)[37],kj::StringPtr_const&>
              (&local_58,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string.c++"
               ,0x252,FAILED,"s != nullptr",
               "_kjCondition,\"String does not contain valid number\", s",
               (DebugComparison<const_kj::StringPtr_&,_std::nullptr_t> *)local_40,
               (char (*) [37])"String does not contain valid number",
               (StringPtr *)_kjCondition._32_8_);
    s_local = (StringPtr *)0x0;
    Debug::Fault::~Fault(&local_58);
  }
  return (double)s_local;
}

Assistant:

double parseDouble(const StringPtr& s) {
  KJ_REQUIRE(s != nullptr, "String does not contain valid number", s) { return 0; }
  char *endPtr;
  errno = 0;
  auto value = _::NoLocaleStrtod(s.begin(), &endPtr);
  KJ_REQUIRE(endPtr == s.end(), "String does not contain valid floating number", s) { return 0; }
#if _WIN32 || __CYGWIN__ || __BIONIC__
  // When Windows' strtod() parses "nan", it returns a value with the sign bit set. But, our
  // preferred canonical value for NaN does not have the sign bit set, and all other platforms
  // return one without the sign bit set. So, on Windows, detect NaN and return our preferred
  // version.
  //
  // Cygwin seemingly does not try to emulate Linux behavior here, but rather allows Windows'
  // behavior to leak through. (Conversely, WINE actually produces the Linux behavior despite
  // trying to behave like Win32...)
  //
  // Bionic (Android) failed the unit test and so I added it to the list without investigating
  // further.
  if (isNaN(value)) {
    // NaN
    return kj::nan();
  }
#endif
  return value;
}